

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compiler.c++
# Opt level: O0

Orphan<capnp::List<capnp::schema::Node::SourceInfo,_(capnp::Kind)3>_> * __thiscall
capnp::compiler::Compiler::Impl::getAllSourceInfo
          (Orphan<capnp::List<capnp::schema::Node::SourceInfo,_(capnp::Kind)3>_>
           *__return_storage_ptr__,Impl *this,Orphanage orphanage)

{
  bool bVar1;
  size_type sVar2;
  reference ppVar3;
  pair<const_unsigned_long,_capnp::schema::Node::SourceInfo::Reader> *entry;
  iterator __end2;
  iterator __begin2;
  unordered_map<unsigned_long,_capnp::schema::Node::SourceInfo::Reader,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_capnp::schema::Node::SourceInfo::Reader>_>_>
  *__range2;
  size_t i;
  undefined1 local_58 [8];
  BuilderFor<capnp::List<capnp::schema::Node::SourceInfo,_(capnp::Kind)3>_> builder;
  Impl *this_local;
  Orphanage orphanage_local;
  Orphan<capnp::List<capnp::schema::Node::SourceInfo,_(capnp::Kind)3>_> *result;
  
  orphanage_local.arena = (BuilderArena *)orphanage.capTable;
  this_local = (Impl *)orphanage.arena;
  builder.builder._39_1_ = 0;
  orphanage_local.capTable = (CapTableBuilder *)__return_storage_ptr__;
  sVar2 = std::
          unordered_map<unsigned_long,_capnp::schema::Node::SourceInfo::Reader,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_capnp::schema::Node::SourceInfo::Reader>_>_>
          ::size(&this->sourceInfoById);
  Orphanage::newOrphan<capnp::List<capnp::schema::Node::SourceInfo,(capnp::Kind)3>>
            (__return_storage_ptr__,(Orphanage *)&this_local,(uint)sVar2);
  Orphan<capnp::List<capnp::schema::Node::SourceInfo,_(capnp::Kind)3>_>::get
            ((BuilderFor<capnp::List<capnp::schema::Node::SourceInfo,_(capnp::Kind)3>_> *)local_58,
             __return_storage_ptr__);
  __range2 = (unordered_map<unsigned_long,_capnp::schema::Node::SourceInfo::Reader,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_capnp::schema::Node::SourceInfo::Reader>_>_>
              *)0x0;
  __end2 = std::
           unordered_map<unsigned_long,_capnp::schema::Node::SourceInfo::Reader,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_capnp::schema::Node::SourceInfo::Reader>_>_>
           ::begin(&this->sourceInfoById);
  entry = (pair<const_unsigned_long,_capnp::schema::Node::SourceInfo::Reader> *)
          std::
          unordered_map<unsigned_long,_capnp::schema::Node::SourceInfo::Reader,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_capnp::schema::Node::SourceInfo::Reader>_>_>
          ::end(&this->sourceInfoById);
  while (bVar1 = std::__detail::operator==
                           (&__end2.
                             super__Node_iterator_base<std::pair<const_unsigned_long,_capnp::schema::Node::SourceInfo::Reader>,_false>
                            ,(_Node_iterator_base<std::pair<const_unsigned_long,_capnp::schema::Node::SourceInfo::Reader>,_false>
                              *)&entry), ((bVar1 ^ 0xffU) & 1) != 0) {
    ppVar3 = std::__detail::
             _Node_iterator<std::pair<const_unsigned_long,_capnp::schema::Node::SourceInfo::Reader>,_false,_false>
             ::operator*(&__end2);
    List<capnp::schema::Node::SourceInfo,_(capnp::Kind)3>::Builder::setWithCaveats
              ((Builder *)local_58,(uint)__range2,&ppVar3->second);
    std::__detail::
    _Node_iterator<std::pair<const_unsigned_long,_capnp::schema::Node::SourceInfo::Reader>,_false,_false>
    ::operator++(&__end2);
    __range2 = (unordered_map<unsigned_long,_capnp::schema::Node::SourceInfo::Reader,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_capnp::schema::Node::SourceInfo::Reader>_>_>
                *)((long)&(__range2->_M_h)._M_buckets + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

Orphan<List<schema::Node::SourceInfo>> Compiler::Impl::getAllSourceInfo(Orphanage orphanage) {
  auto result = orphanage.newOrphan<List<schema::Node::SourceInfo>>(sourceInfoById.size());

  auto builder = result.get();
  size_t i = 0;
  for (auto& entry: sourceInfoById) {
    builder.setWithCaveats(i++, entry.second);
  }

  return result;
}